

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiViewport *pIVar4;
  ImVec2 IVar5;
  
  pIVar1 = GImGui;
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  bVar3 = IsPopupOpen(id,0);
  if (bVar3) {
    if (((pIVar1->NextWindowData).Flags & 1) == 0) {
      pIVar4 = GetMainViewport();
      pIVar2 = GImGui;
      IVar5.x = (pIVar4->Size).x * 0.5 + (pIVar4->Pos).x;
      IVar5.y = (pIVar4->Size).y * 0.5 + (pIVar4->Pos).y;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      (pIVar2->NextWindowData).PosVal = IVar5;
      (pIVar2->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar2->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar2->NextWindowData).PosCond = 4;
    }
    bVar3 = Begin(name,p_open,flags | 0xc000020);
    if (bVar3) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopupToLevel((pIVar1->BeginPopupStack).Size,true);
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar1->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}